

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

MOJOSHADER_glProgram *
MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,MOJOSHADER_glShader *pshader)

{
  GLuint GVar1;
  int iVar2;
  long lVar3;
  UniformMap *pUVar4;
  size_t len_00;
  AttributeMap *pAVar5;
  size_t len_1;
  int count;
  size_t len;
  MOJOSHADER_glProgram *pMStack_30;
  GLuint program;
  MOJOSHADER_glProgram *retval;
  int numregs;
  int bound;
  MOJOSHADER_glShader *pshader_local;
  MOJOSHADER_glShader *vshader_local;
  
  retval._4_4_ = 0;
  if ((vshader == (MOJOSHADER_glShader *)0x0) && (pshader == (MOJOSHADER_glShader *)0x0)) {
    return (MOJOSHADER_glProgram *)0x0;
  }
  retval._0_4_ = 0;
  pMStack_30 = (MOJOSHADER_glProgram *)0x0;
  _numregs = pshader;
  pshader_local = vshader;
  GVar1 = (*ctx->profileLinkProgram)(vshader,pshader);
  if ((GVar1 == 0) ||
     (pMStack_30 = (MOJOSHADER_glProgram *)Malloc(0x2e8), pMStack_30 == (MOJOSHADER_glProgram *)0x0)
     ) goto LAB_00131844;
  memset(pMStack_30,0,0x2e8);
  memset(pMStack_30->vertex_attrib_loc,0xff,0x230);
  retval._0_4_ = 0;
  if (pshader_local != (MOJOSHADER_glShader *)0x0) {
    retval._0_4_ = pshader_local->parseData->uniform_count;
  }
  if (_numregs != (MOJOSHADER_glShader *)0x0) {
    retval._0_4_ = _numregs->parseData->uniform_count + (int)retval;
  }
  if (0 < (int)retval) {
    lVar3 = (long)(int)retval;
    pUVar4 = (UniformMap *)Malloc(lVar3 * 0x18);
    pMStack_30->uniforms = pUVar4;
    if (pMStack_30->uniforms == (UniformMap *)0x0) goto LAB_00131844;
    memset(pMStack_30->uniforms,0,lVar3 * 0x18);
  }
  pMStack_30->handle = GVar1;
  pMStack_30->vertex = pshader_local;
  pMStack_30->fragment = _numregs;
  pMStack_30->generation = ctx->generation - 1;
  pMStack_30->refcount = 1;
  if (pshader_local != (MOJOSHADER_glShader *)0x0) {
    if (0 < pshader_local->parseData->attribute_count) {
      len_00 = (long)pshader_local->parseData->attribute_count << 4;
      pAVar5 = (AttributeMap *)Malloc(len_00);
      pMStack_30->attributes = pAVar5;
      if (pMStack_30->attributes == (AttributeMap *)0x0) goto LAB_00131844;
      memset(pMStack_30->attributes,0,len_00);
      iVar2 = lookup_attributes(pMStack_30);
      if (iVar2 == 0) goto LAB_00131844;
    }
    iVar2 = lookup_uniforms(pMStack_30,pshader_local,(int *)((long)&retval + 4));
    if (iVar2 == 0) goto LAB_00131844;
    lookup_samplers(pMStack_30,pshader_local,(int *)((long)&retval + 4));
    lookup_outputs(pMStack_30,_numregs);
    pshader_local->refcount = pshader_local->refcount + 1;
  }
  if (_numregs != (MOJOSHADER_glShader *)0x0) {
    iVar2 = lookup_uniforms(pMStack_30,_numregs,(int *)((long)&retval + 4));
    if (iVar2 == 0) goto LAB_00131844;
    lookup_samplers(pMStack_30,_numregs,(int *)((long)&retval + 4));
    lookup_outputs(pMStack_30,_numregs);
    _numregs->refcount = _numregs->refcount + 1;
  }
  iVar2 = build_constants_lists(pMStack_30);
  if (iVar2 != 0) {
    if (retval._4_4_ != 0) {
      (*ctx->profileUseProgram)(ctx->bound_program);
    }
    (*ctx->profileFinalInitProgram)(pMStack_30);
    return pMStack_30;
  }
LAB_00131844:
  if (pMStack_30 != (MOJOSHADER_glProgram *)0x0) {
    Free(pMStack_30->vs_uniforms_float4);
    Free(pMStack_30->vs_uniforms_int4);
    Free(pMStack_30->vs_uniforms_bool);
    Free(pMStack_30->ps_uniforms_float4);
    Free(pMStack_30->ps_uniforms_int4);
    Free(pMStack_30->ps_uniforms_bool);
    Free(pMStack_30->uniforms);
    Free(pMStack_30->attributes);
    Free(pMStack_30);
  }
  if (GVar1 != 0) {
    (*ctx->profileDeleteProgram)(GVar1);
  }
  if (retval._4_4_ != 0) {
    (*ctx->profileUseProgram)(ctx->bound_program);
  }
  return (MOJOSHADER_glProgram *)0x0;
}

Assistant:

MOJOSHADER_glProgram *MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,
                                               MOJOSHADER_glShader *pshader)
{
    int bound = 0;

    if ((vshader == NULL) && (pshader == NULL))
        return NULL;

    int numregs = 0;
    MOJOSHADER_glProgram *retval = NULL;
    const GLuint program = ctx->profileLinkProgram(vshader, pshader);
    if (program == 0)
        goto link_program_fail;

    retval = (MOJOSHADER_glProgram *) Malloc(sizeof (MOJOSHADER_glProgram));
    if (retval == NULL)
        goto link_program_fail;
    memset(retval, '\0', sizeof (MOJOSHADER_glProgram));
    memset(retval->vertex_attrib_loc, 0xFF, sizeof(retval->vertex_attrib_loc));

    numregs = 0;
    if (vshader != NULL) numregs += vshader->parseData->uniform_count;
    if (pshader != NULL) numregs += pshader->parseData->uniform_count;
    if (numregs > 0)
    {
        const size_t len = sizeof (UniformMap) * numregs;
        retval->uniforms = (UniformMap *) Malloc(len);
        if (retval->uniforms == NULL)
            goto link_program_fail;
        memset(retval->uniforms, '\0', len);
    } // if

    retval->handle = program;
    retval->vertex = vshader;
    retval->fragment = pshader;
    retval->generation = ctx->generation - 1;
    retval->refcount = 1;

    if (vshader != NULL)
    {
        if (vshader->parseData->attribute_count > 0)
        {
            const int count = vshader->parseData->attribute_count;
            const size_t len = sizeof (AttributeMap) * count;
            retval->attributes = (AttributeMap *) Malloc(len);
            if (retval->attributes == NULL)
                goto link_program_fail;

            memset(retval->attributes, '\0', len);
            if (!lookup_attributes(retval))
                goto link_program_fail;
        } // if

        if (!lookup_uniforms(retval, vshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, vshader, &bound);
        lookup_outputs(retval, pshader);
        vshader->refcount++;
    } // if

    if (pshader != NULL)
    {
        if (!lookup_uniforms(retval, pshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, pshader, &bound);
        lookup_outputs(retval, pshader);
        pshader->refcount++;
    } // if

    if (!build_constants_lists(retval))
        goto link_program_fail;

    if (bound)  // reset the old binding.
        ctx->profileUseProgram(ctx->bound_program);

    ctx->profileFinalInitProgram(retval);

    return retval;

link_program_fail:
    if (retval != NULL)
    {
        Free(retval->vs_uniforms_float4);
        Free(retval->vs_uniforms_int4);
        Free(retval->vs_uniforms_bool);
        Free(retval->ps_uniforms_float4);
        Free(retval->ps_uniforms_int4);
        Free(retval->ps_uniforms_bool);
        Free(retval->uniforms);
        Free(retval->attributes);
        Free(retval);
    } // if

    if (program != 0)
        ctx->profileDeleteProgram(program);

    if (bound)
        ctx->profileUseProgram(ctx->bound_program);

    return NULL;
}